

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_late_unknown_options_no_fail(void)

{
  char **ppcVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  int b;
  int a;
  size_t unknown_count_cpy;
  cargo_t cargo;
  char **unknowns_cpy;
  char *args [7];
  uint local_98;
  uint local_94;
  size_t local_90;
  cargo_t local_88;
  char **local_80;
  long local_78;
  char **local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  iVar4 = cargo_init(&local_88,0,"program");
  if (iVar4 == 0) {
    local_38 = "3";
    local_48 = "--delta";
    pcStack_40 = "--beta";
    local_58 = "123";
    pcStack_50 = "--centauri";
    local_68 = 0x12ab1a;
    uStack_64 = 0;
    uStack_60 = 0x127e2d;
    uStack_5c = 0;
    local_94 = 0;
    local_98 = 0;
    local_80 = (char **)0x0;
    local_90 = 0;
    if (local_88 == (cargo_t)0x0) {
      __assert_fail("ctx",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x127d,"void cargo_set_flags(cargo_t, cargo_flags_t)");
    }
    local_88->flags = CARGO_NO_FAIL_UNKNOWN;
    cargo_add_option(local_88,0,"--alpha","an option","i",&local_94);
    iVar4 = cargo_add_option(local_88,0,"--beta -b","an option","i",&local_98);
    if (iVar4 == 0) {
      iVar4 = cargo_parse(local_88,0,1,7,(char **)&local_68);
      if (iVar4 == 0) {
        printf("a = %d\n",(ulong)local_94);
        printf("b = %d\n",(ulong)local_98);
        if (local_94 == 0x7b) {
          if (local_98 == 3) {
            if (local_88 == (cargo_t)0x0) {
              __assert_fail("ctx",
                            "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                            ,0x14ff,"const char **cargo_get_unknown(cargo_t, size_t *)");
            }
            ppcVar1 = local_88->unknown_opts;
            if (ppcVar1 == (char **)0x0) {
              pcVar5 = "Got NULL unknowns list";
            }
            else {
              sVar2 = local_88->unknown_opts_count;
              if (sVar2 != 0) {
                sVar6 = 0;
                do {
                  puts(ppcVar1[sVar6]);
                  sVar6 = sVar6 + 1;
                } while (sVar2 != sVar6);
              }
              puts("Check that \"unknowns\" has expected_count elements");
              if (sVar2 == 2) {
                lVar8 = -2;
                lVar9 = 1;
                puVar7 = &DAT_001327c0;
                pcVar5 = "Array contains unexpected value";
                local_78 = -2;
                local_70 = ppcVar1;
                do {
                  bVar11 = lVar8 + lVar9 == 1;
                  if (bVar11) {
                    pcVar5 = (char *)0x0;
                    break;
                  }
                  pcVar3 = (char *)*puVar7;
                  printf("  %lu: \"%s\" -> \"%s\"\n",lVar9,ppcVar1[lVar9 + -1],pcVar3);
                  lVar8 = local_78;
                  iVar4 = strcmp(ppcVar1[lVar9 + -1],pcVar3);
                  lVar9 = lVar9 + 1;
                  puVar7 = puVar7 + 1;
                } while (iVar4 == 0);
              }
              else {
                pcVar5 = "unknowns array count unknown_count is not expected expected_count";
                bVar11 = false;
              }
              if (bVar11) {
                local_80 = cargo_get_unknown_copy(local_88,&local_90);
                if (local_80 == (char **)0x0) {
                  pcVar5 = "Got NULL unknowns list (copy)";
                }
                else {
                  if (local_90 != 0) {
                    uVar10 = 0;
                    do {
                      puts(local_80[uVar10]);
                      uVar10 = uVar10 + 1;
                    } while (uVar10 < local_90);
                  }
                  puts("Check that \"unknowns_cpy\" has expected_count elements");
                  if (local_90 == 2) {
                    puVar7 = &DAT_001327c0;
                    uVar10 = 0;
                    do {
                      if (local_90 <= uVar10) goto LAB_0011d5da;
                      pcVar3 = (char *)*puVar7;
                      printf("  %lu: \"%s\" -> \"%s\"\n",uVar10 + 1,local_80[uVar10],pcVar3);
                      iVar4 = strcmp(local_80[uVar10],pcVar3);
                      puVar7 = puVar7 + 1;
                      uVar10 = uVar10 + 1;
                    } while (iVar4 == 0);
                    pcVar5 = "Array contains unexpected value";
                  }
                  else {
                    pcVar5 = 
                    "unknowns_cpy array count unknown_count_cpy is not expected expected_count";
                  }
                }
              }
            }
          }
          else {
            pcVar5 = "b != 3 after unknown option (check after)";
          }
        }
        else {
          pcVar5 = "a != 123 after unknown option (check after)";
        }
      }
      else {
        pcVar5 = "Parse failure on unknown option (late, no fail)";
      }
    }
    else {
      pcVar5 = "Failed to add options";
    }
LAB_0011d5da:
    cargo_free_commandline(&local_80,(int)local_90);
    cargo_destroy(&local_88);
  }
  else {
    pcVar5 = "Failed to init cargo";
  }
  return pcVar5;
}

Assistant:

_TEST_START(TEST_late_unknown_options_no_fail)
{
    char *args[] =
    {
        "program", "--alpha", "123", "--centauri", "--delta", "--beta", "3"
    };
    char *expected[] = { "--centauri", "--delta" };
    size_t expected_count = sizeof(expected) / sizeof(expected[0]);
    int a = 0;
    int b = 0;
    size_t i = 0;
    const char **unknowns = NULL;
    size_t unknown_count = 0;
    char **unknowns_cpy = NULL;
    size_t unknown_count_cpy = 0;

    cargo_set_flags(cargo, CARGO_NO_FAIL_UNKNOWN);

    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i", &a);
    ret = cargo_add_option(cargo, 0, "--beta -b", "an option", "i", &b);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failure on unknown option (late, no fail)");

    printf("a = %d\n", a);
    printf("b = %d\n", b);
    cargo_assert(a == 123, "a != 123 after unknown option (check after)");
    cargo_assert(b == 3,   "b != 3 after unknown option (check after)");

    unknowns = cargo_get_unknown(cargo, &unknown_count);
    cargo_assert(unknowns, "Got NULL unknowns list");
    for (i = 0; i < unknown_count; i++) printf("%s\n", unknowns[i]);
    cargo_assert_str_array(unknown_count, expected_count, unknowns, expected);

    unknowns_cpy = cargo_get_unknown_copy(cargo, &unknown_count_cpy);
    cargo_assert(unknowns_cpy, "Got NULL unknowns list (copy)");
    for (i = 0; i < unknown_count_cpy; i++) printf("%s\n", unknowns_cpy[i]);
    cargo_assert_str_array(unknown_count_cpy, expected_count, unknowns_cpy, expected);

    _TEST_CLEANUP();
    cargo_free_commandline(&unknowns_cpy, unknown_count_cpy);
}